

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeDataSize(BtCursor *pCur,u32 *pSize)

{
  undefined4 uVar1;
  MemPage *in_RSI;
  long in_RDI;
  int iPage;
  
  if (*(short *)(in_RDI + 0x48) == 0) {
    btreeParseCell(in_RSI,(int)*(short *)(in_RDI + 0x70),(CellInfo *)0x148f78);
    *(byte *)(in_RDI + 0x6c) = *(byte *)(in_RDI + 0x6c) | 2;
  }
  uVar1 = *(undefined4 *)(in_RDI + 0x40);
  in_RSI->isInit = (char)uVar1;
  in_RSI->nOverflow = (char)((uint)uVar1 >> 8);
  in_RSI->intKey = (char)((uint)uVar1 >> 0x10);
  in_RSI->intKeyLeaf = (char)((uint)uVar1 >> 0x18);
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDataSize(BtCursor *pCur, u32 *pSize){
  assert( cursorHoldsMutex(pCur) );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->iPage>=0 );
  assert( pCur->iPage<BTCURSOR_MAX_DEPTH );
  assert( pCur->apPage[pCur->iPage]->intKeyLeaf==1 );
  getCellInfo(pCur);
  *pSize = pCur->info.nPayload;
  return SQLITE_OK;
}